

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::Helper::GetIncludeDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmInstallCommandArguments *local_20;
  cmInstallCommandArguments *args_local;
  Helper *this_local;
  
  local_20 = args;
  args_local = (cmInstallCommandArguments *)this;
  this_local = (Helper *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INSTALL_INCLUDEDIR",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"include",&local_79);
  anon_unknown.dwarf_49acb6::Helper::GetDestination
            (__return_storage_ptr__,(Helper *)this,args,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetIncludeDestination(
  const cmInstallCommandArguments* args) const
{
  return this->GetDestination(args, "CMAKE_INSTALL_INCLUDEDIR", "include");
}